

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMemberVarying::~IfcStructuralSurfaceMemberVarying
          (IfcStructuralSurfaceMemberVarying *this)

{
  undefined1 *this_00;
  void *pvVar1;
  
  this_00 = &this[-1].super_IfcStructuralSurfaceMember.super_IfcStructuralMember.
             super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x88;
  *(undefined8 *)
   &this[-1].super_IfcStructuralSurfaceMember.super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x893c40;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0x70 = 0x893d80;
  *(undefined8 *)
   &this[-1].super_IfcStructuralSurfaceMember.super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.field_0x110 = 0x893c68;
  *(undefined8 *)
   &this[-1].super_IfcStructuralSurfaceMember.super_IfcStructuralMember.super_IfcStructuralItem.
    field_0x120 = 0x893c90;
  *(undefined8 *)&this[-1].super_IfcStructuralSurfaceMember.Thickness.have = 0x893cb8;
  this[-1].VaryingThicknessLocation.obj = (LazyObject *)(vtable + 0xb8);
  *(undefined8 *)&this[-1].field_0x198 = 0x893d08;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject = 0x893d30;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0x40 = 0x893d58;
  pvVar1 = *(void **)&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
                      super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x50;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcStructuralSurfaceMember).
                                     super_IfcStructuralMember.super_IfcStructuralItem.
                                     super_IfcProduct.super_IfcObject.field_0x60 - (long)pvVar1);
  }
  IfcStructuralSurfaceMember::~IfcStructuralSurfaceMember
            ((IfcStructuralSurfaceMember *)this_00,&PTR_construction_vtable_24__00893d98);
  operator_delete(this_00,0x1a8);
  return;
}

Assistant:

IfcStructuralSurfaceMemberVarying() : Object("IfcStructuralSurfaceMemberVarying") {}